

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringprintf.cc
# Opt level: O1

void google::protobuf::StringAppendV(string *dst,char *format,__va_list_tag *ap)

{
  uint uVar1;
  uint uVar2;
  char *__s;
  va_list backup_ap;
  char space [1024];
  undefined8 local_458;
  void *pvStack_450;
  void *local_448;
  char local_438 [1032];
  
  local_448 = ap->reg_save_area;
  local_458._0_4_ = ap->gp_offset;
  local_458._4_4_ = ap->fp_offset;
  pvStack_450 = ap->overflow_arg_area;
  uVar1 = vsnprintf(local_438,0x400,format,&local_458);
  if ((int)uVar1 < 0x400) {
    if (-1 < (int)uVar1) {
      std::__cxx11::string::append((char *)dst,(ulong)local_438);
    }
  }
  else {
    __s = (char *)operator_new__((ulong)(uVar1 + 1));
    local_458._0_4_ = ap->gp_offset;
    local_458._4_4_ = ap->fp_offset;
    pvStack_450 = ap->overflow_arg_area;
    local_448 = ap->reg_save_area;
    uVar2 = vsnprintf(__s,(ulong)(uVar1 + 1),format,&local_458);
    if (uVar2 <= uVar1) {
      std::__cxx11::string::append((char *)dst,(ulong)__s);
    }
    operator_delete__(__s);
  }
  return;
}

Assistant:

void StringAppendV(string* dst, const char* format, va_list ap) {
  // First try with a small fixed size buffer
  static const int kSpaceLength = 1024;
  char space[kSpaceLength];

  // It's possible for methods that use a va_list to invalidate
  // the data in it upon use.  The fix is to make a copy
  // of the structure before using it and use that copy instead.
  va_list backup_ap;
  va_copy(backup_ap, ap);
  int result = vsnprintf(space, kSpaceLength, format, backup_ap);
  va_end(backup_ap);

  if (result < kSpaceLength) {
    if (result >= 0) {
      // Normal case -- everything fit.
      dst->append(space, result);
      return;
    }

    if (IS_COMPILER_MSVC) {
      // Error or MSVC running out of space.  MSVC 8.0 and higher
      // can be asked about space needed with the special idiom below:
      va_copy(backup_ap, ap);
      result = vsnprintf(nullptr, 0, format, backup_ap);
      va_end(backup_ap);
    }

    if (result < 0) {
      // Just an error.
      return;
    }
  }

  // Increase the buffer size to the size requested by vsnprintf,
  // plus one for the closing \0.
  int length = result+1;
  char* buf = new char[length];

  // Restore the va_list before we use it again
  va_copy(backup_ap, ap);
  result = vsnprintf(buf, length, format, backup_ap);
  va_end(backup_ap);

  if (result >= 0 && result < length) {
    // It fit
    dst->append(buf, result);
  }
  delete[] buf;
}